

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionAnalyzer.cpp
# Opt level: O1

bool wasm::ExpressionAnalyzer::isResultUsed(ExpressionStack *stack,Function *func)

{
  Id IVar1;
  pointer ppEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  uintptr_t uVar5;
  byte in_AL;
  array<wasm::Expression_*,_10UL> *paVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  array<wasm::Expression_*,_10UL> *paVar10;
  array<wasm::Expression_*,_10UL> *paVar11;
  ulong uVar12;
  bool bVar13;
  Signature SVar14;
  
  ppEVar2 = (stack->flexible).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar7 = (int)((ulong)((long)(stack->flexible).
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2) >> 3) +
          (int)stack->usedFixed;
  bVar9 = iVar7 < 2;
  if (1 < iVar7) {
    paVar6 = (array<wasm::Expression_*,_10UL> *)(ppEVar2 + -10);
    uVar8 = (ulong)(iVar7 - 2);
    do {
      paVar10 = paVar6;
      if (uVar8 < 10) {
        paVar10 = &stack->fixed;
      }
      paVar11 = paVar6;
      if (uVar8 < 9) {
        paVar11 = &stack->fixed;
      }
      pEVar3 = paVar10->_M_elems[uVar8];
      pEVar4 = paVar11->_M_elems[uVar8 + 1];
      IVar1 = pEVar3->_id;
      if (IVar1 == IfId) {
        if (pEVar4 == *(Expression **)(pEVar3 + 1)) {
          in_AL = 1;
          bVar13 = false;
        }
        else if (*(Expression **)(pEVar3 + 2) == (Expression *)0x0) {
          bVar13 = false;
          in_AL = 0;
        }
        else {
          bVar13 = true;
          if ((pEVar4 != *(Expression **)(pEVar3 + 2)) &&
             (pEVar4 != (Expression *)pEVar3[1].type.id)) {
            __assert_fail("above == iff->ifTrue || above == iff->ifFalse",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ExpressionAnalyzer.cpp"
                          ,0x35,
                          "static bool wasm::ExpressionAnalyzer::isResultUsed(ExpressionStack &, Function *)"
                         );
          }
        }
        if (!bVar13) goto LAB_006a7e2c;
LAB_006a7e1d:
        bVar13 = true;
      }
      else {
        if (IVar1 == BlockId) {
          uVar5 = pEVar3[2].type.id;
          bVar13 = uVar5 != 1;
          if (bVar13) {
            uVar12 = 1;
            do {
              if (uVar12 - uVar5 == 1) {
                __assert_fail("index < usedElements",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                              ,0xbc,
                              "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                             );
              }
              if (*(Expression **)(*(long *)(pEVar3 + 2) + -8 + uVar12 * 8) == pEVar4) {
                in_AL = 0;
                break;
              }
              bVar13 = uVar12 < uVar5 - 1;
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar5);
          }
          if (!bVar13) {
            if (uVar5 == 0) {
              __assert_fail("usedElements > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                            ,0xd0,
                            "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                           );
            }
            if (*(Expression **)(*(long *)(pEVar3 + 2) + -8 + uVar5 * 8) != pEVar4) {
              __assert_fail("block->list.back() == above",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ExpressionAnalyzer.cpp"
                            ,0x2b,
                            "static bool wasm::ExpressionAnalyzer::isResultUsed(ExpressionStack &, Function *)"
                           );
            }
            goto LAB_006a7e1d;
          }
        }
        else {
          in_AL = IVar1 != DropId;
        }
LAB_006a7e2c:
        bVar13 = false;
      }
      if (!bVar13) break;
      bVar9 = (long)uVar8 < 1;
      bVar13 = 0 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar13);
  }
  if (bVar9) {
    SVar14 = HeapType::getSignature(&func->type);
    in_AL = SVar14.results.id.id != 0;
  }
  return (bool)(in_AL & 1);
}

Assistant:

bool ExpressionAnalyzer::isResultUsed(ExpressionStack& stack, Function* func) {
  for (int i = int(stack.size()) - 2; i >= 0; i--) {
    auto* curr = stack[i];
    auto* above = stack[i + 1];
    // only if and block can drop values (pre-drop expression was added) FIXME
    if (curr->is<Block>()) {
      auto* block = curr->cast<Block>();
      for (size_t j = 0; j < block->list.size() - 1; j++) {
        if (block->list[j] == above) {
          return false;
        }
      }
      assert(block->list.back() == above);
      // continue down
    } else if (curr->is<If>()) {
      auto* iff = curr->cast<If>();
      if (above == iff->condition) {
        return true;
      }
      if (!iff->ifFalse) {
        return false;
      }
      assert(above == iff->ifTrue || above == iff->ifFalse);
      // continue down
    } else {
      if (curr->is<Drop>()) {
        return false;
      }
      return true; // all other node types use the result
    }
  }
  // The value might be used, so it depends on if the function returns
  return func->getResults() != Type::none;
}